

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

bool pugi::impl::anon_unknown_0::node_is_before_sibling(xml_node_struct *ln,xml_node_struct *rn)

{
  xml_node_struct *pxVar1;
  xml_node_struct *pxVar2;
  bool bVar3;
  
  pxVar1 = rn;
  pxVar2 = ln;
  if (ln->parent == (xml_node_struct *)0x0) {
    bVar3 = ln < rn;
  }
  else {
    while( true ) {
      if ((pxVar2 == (xml_node_struct *)0x0) || (pxVar1 == (xml_node_struct *)0x0)) {
        return pxVar1 == (xml_node_struct *)0x0;
      }
      bVar3 = pxVar2 == rn;
      if ((bVar3) || (pxVar1 == ln)) break;
      pxVar1 = pxVar1->next_sibling;
      pxVar2 = pxVar2->next_sibling;
    }
  }
  return bVar3;
}

Assistant:

PUGI_IMPL_FN bool node_is_before_sibling(xml_node_struct* ln, xml_node_struct* rn)
	{
		assert(ln->parent == rn->parent);

		// there is no common ancestor (the shared parent is null), nodes are from different documents
		if (!ln->parent) return ln < rn;

		// determine sibling order
		xml_node_struct* ls = ln;
		xml_node_struct* rs = rn;

		while (ls && rs)
		{
			if (ls == rn) return true;
			if (rs == ln) return false;

			ls = ls->next_sibling;
			rs = rs->next_sibling;
		}

		// if rn sibling chain ended ln must be before rn
		return !rs;
	}